

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O2

void __thiscall
LazySegtree_BenchmarkN100000Q100000_Test::TestBody(LazySegtree_BenchmarkN100000Q100000_Test *this)

{
  int iVar1;
  int iVar2;
  ll rhs;
  long lhs;
  char *message;
  int to;
  int qi;
  uint uVar3;
  int fr;
  undefined1 local_88 [8];
  Segtree tree;
  AssertionResult gtest_ar;
  int fr_1;
  AssertHelper local_38;
  
  local_88 = (undefined1  [8])0xde0b6b3a7640000;
  tree.INF = 0x186a000000000;
  tree.l = 0;
  tree.r = 0;
  tree.val = 0;
  tree.lazy = 0;
  tree.lson = (Segtree *)0x0;
  lhs = 0;
  for (uVar3 = 0; uVar3 != 100000; uVar3 = uVar3 + 1) {
    iVar1 = rand();
    iVar2 = rand();
    iVar2 = 100000 - iVar2 % 0x32;
    if ((uVar3 & 1) == 0) {
      Segtree::rangeQuery((Segtree *)local_88,iVar1 % 0x32,iVar2);
    }
    else {
      gtest_ar.message_.ptr_._4_4_ = iVar1 % 0x32;
      iVar1 = rand();
      Segtree::rangeUpdate
                ((Segtree *)local_88,gtest_ar.message_.ptr_._4_4_,iVar2,(long)(iVar1 % 1000000));
      lhs = lhs + iVar1 % 1000000;
    }
  }
  rhs = Segtree::rangeQuery((Segtree *)local_88,50000,0xc351);
  testing::internal::CmpHelperEQ((internal *)&tree.rson,"tot","tree.rangeQuery(n/2, n/2+1)",lhs,rhs)
  ;
  if ((char)tree.rson == '\0') {
    testing::Message::Message((Message *)&stack0xffffffffffffffc0);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/lazy_segtree_test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&stack0xffffffffffffffc0);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&stack0xffffffffffffffc0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  Segtree::~Segtree((Segtree *)local_88);
  return;
}

Assistant:

TEST(LazySegtree, BenchmarkN100000Q100000) {
    int n = 100000;
    int q = 100000;
    int margin = 50;

    Segtree tree(0,n);
    ll tot = 0;
    rep(qi, 0, q) {
        if (qi % 2 == 0) {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            tree.rangeQuery(fr, to);
        } else {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            ll val = rand() % 1000000;
            tot += val;
            tree.rangeUpdate(fr, to, val);
        }
    }
    EXPECT_EQ(tot, tree.rangeQuery(n/2, n/2+1));
}